

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RewindLoopFixedGroupLastIterationCont::Exec
          (RewindLoopFixedGroupLastIterationCont *this,Matcher *matcher,Char *input,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  CharCount CVar4;
  BeginLoopFixedGroupLastIterationInst *pBVar5;
  LoopInfo *pLVar6;
  GroupInfo *pGVar7;
  undefined4 *puVar8;
  uint8 *puVar9;
  CharCount CVar10;
  
  Matcher::QueryContinue(matcher,qcTicks);
  pBVar5 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopFixedGroupLastIterationInst>
                     (matcher,BeginLoopFixedGroupLastIteration,
                      *(Label *)&(this->super_Cont).field_0xc);
  pLVar6 = Matcher::LoopIdToLoopInfo
                     (matcher,(pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  pGVar7 = Matcher::GroupIdToGroupInfo(matcher,(pBVar5->super_GroupMixin).groupId);
  if (this->tryingBody == true) {
    this->tryingBody = false;
    uVar3 = pLVar6->number;
    if (uVar3 < (pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12ee,"(loopInfo->number >= begin->repeats.lower)",
                         "loopInfo->number >= begin->repeats.lower");
      if (!bVar2) {
LAB_00d49bc9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
      uVar3 = pLVar6->number;
    }
  }
  else {
    uVar3 = pLVar6->number;
    if (uVar3 <= (pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12f3,"(loopInfo->number > begin->repeats.lower)",
                         "loopInfo->number > begin->repeats.lower");
      if (!bVar2) goto LAB_00d49bc9;
      *puVar8 = 0;
      uVar3 = pLVar6->number;
    }
    uVar3 = uVar3 - 1;
    pLVar6->number = uVar3;
  }
  CVar4 = uVar3 * (pBVar5->super_FixedLengthMixin).length + pLVar6->startInputOffset;
  *inputOffset = CVar4;
  uVar3 = pLVar6->number;
  if (uVar3 == 0) {
    CVar10 = 0xffffffff;
  }
  else {
    CVar10 = (pBVar5->super_FixedLengthMixin).length;
    pGVar7->offset = CVar4 - CVar10;
  }
  pGVar7->length = CVar10;
  if ((pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower < uVar3) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  puVar9 = Matcher::LabelToInstPointer(matcher,(pBVar5->super_BeginLoopMixin).exitLabel);
  *instPointer = puVar9;
  return true;
}

Assistant:

inline bool RewindLoopFixedGroupLastIterationCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);
        GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);

        if (tryingBody)
        {
            tryingBody = false;
            // loopInfo->number is the number of iterations completed before current attempt of body
            Assert(loopInfo->number >= begin->repeats.lower);
        }
        else
        {
            // loopInfo->number is the number of iterations completed before trying follow
            Assert(loopInfo->number > begin->repeats.lower);
            // Try follow with one fewer iteration
            loopInfo->number--;
        }

        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number * begin->length;

        if (loopInfo->number > 0)
        {
            // Bind previous iteration's body
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;
        }
        else
        {
            groupInfo->Reset();
        }

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopFixedGroupLastIterationCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return true; // STOP BACKTRACKING
    }